

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O1

void __thiscall
chrono::ChVariablesNode::DiagonalAdd(ChVariablesNode *this,ChVectorRef *result,double c_a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  ulong uVar11;
  undefined8 in_XMM0_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  uVar4 = (this->super_ChVariables).offset;
  lVar10 = (long)(int)uVar4;
  if ((-1 < lVar10) &&
     (lVar5 = *(long *)&(result->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ).field_0x8, lVar10 < lVar5)) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = this->mass;
    uVar11 = (ulong)uVar4;
    lVar6 = *(long *)&result->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(lVar6 + lVar10 * 8);
    auVar7._8_8_ = in_XMM0_Qb;
    auVar7._0_8_ = c_a;
    auVar1 = vfmadd213sd_fma(auVar12,auVar7,auVar1);
    *(long *)(lVar6 + lVar10 * 8) = auVar1._0_8_;
    if ((long)(uVar11 + 1) < lVar5) {
      auVar13._8_8_ = 0;
      auVar13._0_8_ = this->mass;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(lVar6 + 8 + uVar11 * 8);
      auVar8._8_8_ = in_XMM0_Qb;
      auVar8._0_8_ = c_a;
      auVar1 = vfmadd213sd_fma(auVar13,auVar8,auVar2);
      *(long *)(lVar6 + 8 + uVar11 * 8) = auVar1._0_8_;
      uVar11 = (ulong)(uVar4 + 2);
      if ((long)uVar11 < lVar5) {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = this->mass;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *(ulong *)(lVar6 + uVar11 * 8);
        auVar9._8_8_ = in_XMM0_Qb;
        auVar9._0_8_ = c_a;
        auVar1 = vfmadd213sd_fma(auVar14,auVar9,auVar3);
        *(long *)(lVar6 + uVar11 * 8) = auVar1._0_8_;
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
               );
}

Assistant:

void ChVariablesNode::DiagonalAdd(ChVectorRef result, const double c_a) const {
    result(this->offset) += c_a * mass;
    result(this->offset + 1) += c_a * mass;
    result(this->offset + 2) += c_a * mass;
}